

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandLcorr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  char *pcVar5;
  uint fVerbose;
  int iVar6;
  char *pcVar7;
  uint local_50;
  uint local_4c;
  uint local_48;
  
  pAVar4 = Abc_FrameReadNtk(pAbc);
  local_4c = 0;
  Extra_UtilGetoptReset();
  bVar1 = true;
  local_50 = 1000;
  local_48 = 1000;
  fVerbose = 0;
LAB_00218dfe:
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"PCSnvh"), iVar6 = globalUtilOptind, iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 < 0x50) {
      if (iVar2 == -1) {
        if (pAVar4 == (Abc_Ntk_t *)0x0) {
          pcVar5 = "Empty network.\n";
        }
        else {
          if (pAVar4->nObjCounts[8] == 0) {
            pcVar5 = "The network is combinational (run \"fraig\" or \"fraig_sweep\").\n";
LAB_00218f08:
            Abc_Print(-1,pcVar5);
            return 0;
          }
          if (pAVar4->ntkType != ABC_NTK_STRASH) {
            pcVar5 = "This command works only for structrally hashed networks. Run \"st\".\n";
            goto LAB_00218f08;
          }
          if (bVar1) {
            pAVar4 = Abc_NtkDarLcorrNew(pAVar4,local_48,local_50,fVerbose);
          }
          else {
            pAVar4 = Abc_NtkDarLcorr(pAVar4,local_4c,local_50,fVerbose);
          }
          if (pAVar4 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar4);
            return 0;
          }
          pcVar5 = "Sequential sweeping has failed.\n";
        }
        iVar6 = -1;
        goto LAB_00219031;
      }
      if (iVar2 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
          goto LAB_00218f65;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_50 = uVar3;
        goto LAB_00218eaa;
      }
      goto LAB_00218f71;
    }
    if (iVar2 == 0x6e) {
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_00218dfe;
    }
    if (iVar2 == 0x53) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_00218f65;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_48 = uVar3;
    }
    else {
      if (iVar2 != 0x50) goto LAB_00218f71;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-P\" should be followed by an integer.\n";
LAB_00218f65:
        Abc_Print(-1,pcVar5);
        goto LAB_00218f71;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_4c = uVar3;
    }
LAB_00218eaa:
    globalUtilOptind = iVar6 + 1;
    if ((int)uVar3 < 0) {
LAB_00218f71:
      Abc_Print(-2,"usage: lcorr [-PCS num] [-nvh]\n");
      Abc_Print(-2,"\t         computes latch correspondence using 1-step induction\n");
      Abc_Print(-2,"\t-P num : number of time frames to use as the prefix [default = %d]\n",
                (ulong)local_4c);
      Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",(ulong)local_50);
      Abc_Print(-2,"\t-S num : the max number of SAT variables [default = %d]\n",(ulong)local_48);
      pcVar7 = "yes";
      pcVar5 = "yes";
      if (!bVar1) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-n     : toggle using new algorithm [default = %s]\n",pcVar5);
      if (fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar7);
      pcVar5 = "\t-h     : print the command usage\n";
      iVar6 = -2;
LAB_00219031:
      Abc_Print(iVar6,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandLcorr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int nFramesP;
    int nConfMax;
    int nVarsMax;
    int fNewAlgor;
    int fVerbose;
    extern Abc_Ntk_t * Abc_NtkDarLcorr( Abc_Ntk_t * pNtk, int nFramesP, int nConfMax, int fVerbose );
    extern Abc_Ntk_t * Abc_NtkDarLcorrNew( Abc_Ntk_t * pNtk, int nVarsMax, int nConfMax, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);



    // set defaults
    nFramesP   =     0;
    nConfMax   =  1000;
    nVarsMax   =  1000;
    fNewAlgor  =     1;
    fVerbose   =     0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PCSnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesP = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesP < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nVarsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVarsMax < 0 )
                goto usage;
            break;
        case 'n':
            fNewAlgor ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "The network is combinational (run \"fraig\" or \"fraig_sweep\").\n" );
        return 0;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for structrally hashed networks. Run \"st\".\n" );
        return 0;
    }

    // get the new network
    if ( fNewAlgor )
        pNtkRes = Abc_NtkDarLcorrNew( pNtk, nVarsMax, nConfMax, fVerbose );
    else
        pNtkRes = Abc_NtkDarLcorr( pNtk, nFramesP, nConfMax, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Sequential sweeping has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: lcorr [-PCS num] [-nvh]\n" );
    Abc_Print( -2, "\t         computes latch correspondence using 1-step induction\n" );
    Abc_Print( -2, "\t-P num : number of time frames to use as the prefix [default = %d]\n", nFramesP );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-S num : the max number of SAT variables [default = %d]\n", nVarsMax );
    Abc_Print( -2, "\t-n     : toggle using new algorithm [default = %s]\n", fNewAlgor? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}